

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

void b64_encode(archive_string *as,uchar *p,size_t len)

{
  ulong in_RDX;
  byte *in_RSI;
  wchar_t c;
  char in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  ulong local_18;
  byte *local_10;
  
  local_10 = in_RSI;
  for (local_18 = in_RDX; 2 < local_18; local_18 = local_18 - 3) {
    archive_strappend_char
              ((archive_string *)CONCAT44((int)(uint)*local_10 >> 2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdf);
    archive_strappend_char
              ((archive_string *)
               CONCAT44((*local_10 & 3) << 4 | (int)(local_10[1] & 0xf0) >> 4,
                        in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdf);
    archive_strappend_char
              ((archive_string *)
               CONCAT44((local_10[1] & 0xf) << 2 | (int)(local_10[2] & 0xc0) >> 6,
                        in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdf);
    in_stack_ffffffffffffffe4 = local_10[2] & 0x3f;
    archive_strappend_char
              ((archive_string *)
               ((ulong)CONCAT14(local_10[2],in_stack_ffffffffffffffe0) & 0x3fffffffff),
               in_stack_ffffffffffffffdf);
    local_10 = local_10 + 3;
  }
  if (local_18 != 0) {
    archive_strappend_char
              ((archive_string *)CONCAT44((int)(uint)*local_10 >> 2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdf);
    in_stack_ffffffffffffffe4 = (*local_10 & 3) << 4;
    if (local_18 == 1) {
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdf);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdf);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdf);
    }
    else {
      archive_strappend_char
                ((archive_string *)
                 CONCAT44((int)(local_10[1] & 0xf0) >> 4 | in_stack_ffffffffffffffe4,
                          in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdf);
      in_stack_ffffffffffffffe4 = (local_10[1] & 0xf) << 2;
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdf);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdf);
    }
  }
  archive_strappend_char
            ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdf);
  return;
}

Assistant:

static void
b64_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, base64[c]);
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, base64[c]);
		c = p[2] & 0x3f;
		archive_strappend_char(as, base64[c]);
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
			archive_strappend_char(as, '=');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, base64[c]);
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
		}
	}
	archive_strappend_char(as, '\n');
}